

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetBox2fAttribute
              (ImfHeader *hdr,char *name,float xMin,float yMin,float xMax,float yMax)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *pTVar3;
  Box2f box;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> local_30;
  
  box.min.x = xMin;
  box.min.y = yMin;
  box.max.x = xMax;
  box.max.y = yMax;
  IVar1 = Imf_3_2::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_2::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::TypedAttribute
              (&local_30,&box);
    Imf_3_2::Header::insert((Header *)hdr,name,&local_30.super_Attribute);
    Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::~TypedAttribute(&local_30);
  }
  else {
    pTVar3 = Imf_3_2::Header::
             typedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>>
                       ((Header *)hdr,name);
    (pTVar3->_value).min.x = xMin;
    (pTVar3->_value).min.y = yMin;
    (pTVar3->_value).max.x = xMax;
    (pTVar3->_value).max.y = yMax;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetBox2fAttribute (
    ImfHeader* hdr,
    const char name[],
    float      xMin,
    float      yMin,
    float      xMax,
    float      yMax)
{
    try
    {
        Box2f box (V2f (xMin, yMin), V2f (xMax, yMax));

        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::Box2fAttribute (box));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::Box2fAttribute> (name)
                .value () = box;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}